

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

bool __thiscall zmq::zmtp_engine_t::handshake_v1_0_unversioned(zmtp_engine_t *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  msg_t *this_00;
  i_decoder *piVar4;
  long lVar5;
  void *__dest;
  undefined4 extraout_var;
  stream_engine_base_t *in_RDI;
  size_t buffer_size;
  int rc;
  uchar *bufferp;
  uchar tmp [10];
  size_t header_size;
  session_base_t *in_stack_ffffffffffffff70;
  i_decoder *size_;
  msg_t *local_80;
  v1_encoder_t *in_stack_ffffffffffffff90;
  undefined1 *local_60;
  undefined1 local_52 [2];
  int64_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  error_reason_t reason_;
  stream_engine_base_t *in_stack_ffffffffffffffd0;
  bool local_1;
  
  reason_ = (error_reason_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  stream_engine_base_t::session(in_RDI);
  bVar1 = session_base_t::zap_enabled(in_stack_ffffffffffffff70);
  if (bVar1) {
    stream_engine_base_t::error(in_stack_ffffffffffffffd0,reason_);
    local_1 = false;
  }
  else {
    this_00 = (msg_t *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    local_80 = (msg_t *)0x0;
    if (this_00 != (msg_t *)0x0) {
      v1_encoder_t::v1_encoder_t(in_stack_ffffffffffffff90,(size_t)in_RDI);
      local_80 = this_00;
    }
    in_RDI->_encoder = (i_encoder *)local_80;
    if (in_RDI->_encoder == (i_encoder *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x106);
      fflush(_stderr);
      zmq_abort((char *)0x24391c);
    }
    iVar3 = 0x2ce108;
    piVar4 = (i_decoder *)operator_new(0x90,(nothrow_t *)&std::nothrow);
    size_ = (i_decoder *)0x0;
    if (piVar4 != (i_decoder *)0x0) {
      iVar3 = (in_RDI->_options).in_batch_size;
      v1_decoder_t::v1_decoder_t
                ((v1_decoder_t *)CONCAT17(1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      size_ = piVar4;
    }
    in_RDI->_decoder = size_;
    if (in_RDI->_decoder == (i_decoder *)0x0) {
      iVar3 = 0x25824b;
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x10a);
      fflush(_stderr);
      zmq_abort((char *)0x243a15);
    }
    iVar2 = 2;
    if (0xfe < (in_RDI->_options).routing_id_size + 1) {
      iVar2 = 10;
    }
    lVar5 = (long)iVar2;
    local_60 = local_52;
    iVar3 = msg_t::close((msg_t *)(in_RDI + 1),iVar3);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x117);
      fflush(_stderr);
      zmq_abort((char *)0x243add);
    }
    iVar3 = msg_t::init_size(this_00,(size_t)size_);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x119);
      fflush(_stderr);
      zmq_abort((char *)0x243b54);
    }
    __dest = msg_t::data(this_00);
    memcpy(__dest,(in_RDI->_options).routing_id,(ulong)(in_RDI->_options).routing_id_size);
    (*in_RDI->_encoder->_vptr_i_encoder[3])(in_RDI->_encoder,in_RDI + 1);
    iVar3 = (*in_RDI->_encoder->_vptr_i_encoder[2])(in_RDI->_encoder,&local_60,lVar5);
    if (CONCAT44(extraout_var,iVar3) != lVar5) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buffer_size == header_size",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x11e);
      fflush(_stderr);
      zmq_abort((char *)0x243c1b);
    }
    in_RDI->_inpos = in_RDI[1]._options.routing_id + 0x5f;
    in_RDI->_insize = (ulong)*(uint *)(in_RDI[1]._options.routing_id + 0xdf);
    if (((in_RDI->_options).type == '\x01') || ((in_RDI->_options).type == '\t')) {
      in_RDI[1]._options.routing_id[0xe3] = '\x01';
    }
    in_RDI->_next_msg =
         (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::pull_msg_from_session;
    *(undefined8 *)&in_RDI->field_0x550 = 0;
    in_RDI->_process_msg = (offset_in_stream_engine_base_t_to_subr)process_routing_id_msg;
    *(undefined8 *)&in_RDI->field_0x560 = 0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v1_0_unversioned ()
{
    //  We send and receive rest of routing id message
    if (session ()->zap_enabled ()) {
        // reject ZMTP 1.0 connections if ZAP is enabled
        error (protocol_error);
        return false;
    }

    _encoder = new (std::nothrow) v1_encoder_t (_options.out_batch_size);
    alloc_assert (_encoder);

    _decoder = new (std::nothrow)
      v1_decoder_t (_options.in_batch_size, _options.maxmsgsize);
    alloc_assert (_decoder);

    //  We have already sent the message header.
    //  Since there is no way to tell the encoder to
    //  skip the message header, we simply throw that
    //  header data away.
    const size_t header_size =
      _options.routing_id_size + 1 >= UCHAR_MAX ? 10 : 2;
    unsigned char tmp[10], *bufferp = tmp;

    //  Prepare the routing id message and load it into encoder.
    //  Then consume bytes we have already sent to the peer.
    int rc = _routing_id_msg.close ();
    zmq_assert (rc == 0);
    rc = _routing_id_msg.init_size (_options.routing_id_size);
    zmq_assert (rc == 0);
    memcpy (_routing_id_msg.data (), _options.routing_id,
            _options.routing_id_size);
    _encoder->load_msg (&_routing_id_msg);
    const size_t buffer_size = _encoder->encode (&bufferp, header_size);
    zmq_assert (buffer_size == header_size);

    //  Make sure the decoder sees the data we have already received.
    _inpos = _greeting_recv;
    _insize = _greeting_bytes_read;

    //  To allow for interoperability with peers that do not forward
    //  their subscriptions, we inject a phantom subscription message
    //  message into the incoming message stream.
    if (_options.type == ZMQ_PUB || _options.type == ZMQ_XPUB)
        _subscription_required = true;

    //  We are sending our routing id now and the next message
    //  will come from the socket.
    _next_msg = &zmtp_engine_t::pull_msg_from_session;

    //  We are expecting routing id message.
    _process_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::process_routing_id_msg);

    return true;
}